

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::~GeometryShaderRenderTest
          (GeometryShaderRenderTest *this)

{
  code *pcVar1;
  GeometryShaderRenderTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

GeometryShaderRenderTest::~GeometryShaderRenderTest (void)
{
	deinit();
}